

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

void EthBasePort::PrintMAC(ostream *outStr,char *name,uint8_t *addr,bool swap16)

{
  ostream *poVar1;
  undefined7 in_register_00000009;
  byte *pbVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  poVar1 = std::operator<<(outStr,name);
  poVar1 = std::operator<<(poVar1,": ");
  lVar6 = *(long *)poVar1;
  lVar4 = *(long *)(lVar6 + -0x18);
  *(uint *)(poVar1 + lVar4 + 0x18) = *(uint *)(poVar1 + lVar4 + 0x18) & 0xffffffb5 | 8;
  *(undefined8 *)(poVar1 + *(long *)(lVar6 + -0x18) + 0x10) = 2;
  poVar1 = std::operator<<(poVar1,0x30);
  if ((int)CONCAT71(in_register_00000009,swap16) == 0) {
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*addr);
    poVar1 = std::operator<<(poVar1,":");
    pbVar2 = addr + 1;
    lVar6 = 5;
    lVar4 = 4;
    lVar5 = 3;
    lVar3 = 2;
  }
  else {
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)addr[1]);
    poVar1 = std::operator<<(poVar1,":");
    lVar6 = 4;
    lVar4 = 5;
    lVar5 = 2;
    lVar3 = 3;
    pbVar2 = addr;
  }
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*pbVar2);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)addr[lVar3]);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)addr[lVar5]);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)addr[lVar4]);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)addr[lVar6]);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void EthBasePort::PrintMAC(std::ostream &outStr, const char* name, const uint8_t *addr, bool swap16)
{
    if (swap16) {
        outStr << name << ": " << std::hex << std::setw(2) << std::setfill('0')
               << (int)addr[1] << ":" << (int)addr[0] << ":" << (int)addr[3] << ":"
               << (int)addr[2] << ":" << (int)addr[5] << ":" << (int)addr[4] << std::dec << std::endl;
    }
    else {
        outStr << name << ": " << std::hex << std::setw(2) << std::setfill('0')
               << (int)addr[0] << ":" << (int)addr[1] << ":" << (int)addr[2] << ":"
               << (int)addr[3] << ":" << (int)addr[4] << ":" << (int)addr[5] << std::dec << std::endl;
    }
}